

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O2

IHEVCD_ERROR_T ihevcd_parse_sps(codec_t *ps_codec)

{
  bitstrm_t *ps_bitstrm;
  sps_t *psVar1;
  sps_t *psVar2;
  short sVar3;
  short sVar4;
  char cVar5;
  char cVar6;
  UWORD8 UVar7;
  short sVar8;
  WORD16 WVar9;
  UWORD16 UVar10;
  UWORD32 UVar11;
  UWORD32 UVar12;
  UWORD32 UVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  WORD32 in_ECX;
  UWORD32 UVar17;
  uint uVar18;
  long lVar19;
  stref_picset_t *ps_stref_picset;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  UWORD16 UVar25;
  sub_lyr_hrd_params_t *ps_sub_layer_hrd_params;
  bool bVar26;
  profile_tier_lvl_info_t s_ptl;
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  UVar11 = ihevcd_bits_get(ps_bitstrm,4);
  if ((int)UVar11 < 1) {
    UVar11 = 0;
  }
  UVar13 = 0xf;
  if ((int)UVar11 < 0xf) {
    UVar13 = UVar11;
  }
  UVar11 = ihevcd_bits_get(ps_bitstrm,3);
  if ((int)UVar11 < 1) {
    UVar11 = 0;
  }
  UVar17 = 6;
  if ((int)UVar11 < 6) {
    UVar17 = UVar11;
  }
  UVar11 = ihevcd_bits_get(ps_bitstrm,1);
  ihevcd_profile_tier_level(ps_bitstrm,&s_ptl,UVar17,in_ECX);
  UVar12 = ihevcd_uev(ps_bitstrm);
  if ((0x10 < UVar12) && (UVar12 = 0, ps_codec->i4_sps_done != 0)) {
    return IHEVCD_UNSUPPORTED_SPS_ID;
  }
  psVar1 = (ps_codec->s_parse).ps_sps_base;
  psVar1[0x10].i1_sps_id = (WORD8)UVar12;
  psVar1[0x10].i1_vps_id = (WORD8)UVar13;
  psVar1[0x10].i1_sps_max_sub_layers = (char)UVar17 + '\x01';
  psVar1[0x10].i1_sps_temporal_id_nesting_flag = (WORD8)UVar11;
  ps_codec->i4_sps_id = UVar12;
  memcpy(&psVar1[0x10].s_ptl,&s_ptl,0x163);
  UVar11 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i1_chroma_format_idc = (char)UVar11;
  if ((char)UVar11 != '\x01') {
    (ps_codec->s_parse).i4_error_code = 0xda;
    return 0xda;
  }
  psVar1[0x10].i1_separate_colour_plane_flag = '\0';
  UVar11 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i2_pic_width_in_luma_samples = (WORD16)UVar11;
  UVar11 = ihevcd_uev(ps_bitstrm);
  sVar8 = (short)UVar11;
  psVar1[0x10].i2_pic_height_in_luma_samples = sVar8;
  if (0 < sVar8 && 0 < psVar1[0x10].i2_pic_width_in_luma_samples) {
    uVar14 = CONCAT22(sVar8 + 7,psVar1[0x10].i2_pic_width_in_luma_samples + 7) & (uint)DAT_0016a4b0;
    psVar1[0x10].i2_pic_width_in_luma_samples = (short)uVar14;
    psVar1[0x10].i2_pic_height_in_luma_samples = (short)(uVar14 >> 0x10);
    UVar11 = ihevcd_bits_get(ps_bitstrm,1);
    psVar1[0x10].i1_pic_cropping_flag = (char)UVar11;
    if ((char)UVar11 == '\0') {
      psVar1[0x10].i2_pic_crop_left_offset = 0;
      psVar1[0x10].i2_pic_crop_right_offset = 0;
      psVar1[0x10].i2_pic_crop_top_offset = 0;
      WVar9 = 0;
    }
    else {
      UVar11 = ihevcd_uev(ps_bitstrm);
      psVar1[0x10].i2_pic_crop_left_offset = (WORD16)UVar11;
      UVar11 = ihevcd_uev(ps_bitstrm);
      psVar1[0x10].i2_pic_crop_right_offset = (WORD16)UVar11;
      UVar11 = ihevcd_uev(ps_bitstrm);
      psVar1[0x10].i2_pic_crop_top_offset = (WORD16)UVar11;
      UVar11 = ihevcd_uev(ps_bitstrm);
      WVar9 = (WORD16)UVar11;
    }
    psVar1[0x10].i2_pic_crop_bottom_offset = WVar9;
    UVar11 = ihevcd_uev(ps_bitstrm);
    if (UVar11 != 0) {
      return IHEVCD_UNSUPPORTED_BIT_DEPTH;
    }
    UVar11 = ihevcd_uev(ps_bitstrm);
    if (UVar11 != 0) {
      return IHEVCD_UNSUPPORTED_BIT_DEPTH;
    }
    UVar11 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].i1_log2_max_pic_order_cnt_lsb = (char)UVar11 + '\x04';
    UVar11 = ihevcd_bits_get(ps_bitstrm,1);
    psVar1[0x10].i1_sps_sub_layer_ordering_info_present_flag = (char)UVar11;
    if ((char)UVar11 == '\0') {
      lVar19 = (long)psVar1[0x10].i1_sps_max_sub_layers + -1;
    }
    else {
      lVar19 = 0;
    }
    for (; lVar15 = (long)psVar1[0x10].i1_sps_max_sub_layers, lVar19 < lVar15; lVar19 = lVar19 + 1)
    {
      UVar11 = ihevcd_uev(ps_bitstrm);
      cVar5 = (char)UVar11 + '\x01';
      psVar1[0x10].ai1_sps_max_dec_pic_buffering[lVar19] = cVar5;
      if ('\x10' < cVar5) {
        return IHEVCD_INVALID_PARAMETER;
      }
      UVar11 = ihevcd_uev(ps_bitstrm);
      psVar1[0x10].ai1_sps_max_num_reorder_pics[lVar19] = (char)UVar11;
      if (psVar1[0x10].ai1_sps_max_dec_pic_buffering[lVar19] < (char)UVar11) {
        return IHEVCD_INVALID_PARAMETER;
      }
      UVar11 = ihevcd_uev(ps_bitstrm);
      psVar1[0x10].ai1_sps_max_latency_increase[lVar19] = (WORD8)UVar11;
    }
    if (ps_codec->i4_first_pic_done != 0) {
      psVar2 = (ps_codec->s_parse).ps_sps;
      if ((psVar2->ai1_sps_max_dec_pic_buffering[(long)psVar2->i1_sps_max_sub_layers + -1] !=
           psVar1[0x10].ai1_sps_max_dec_pic_buffering[lVar15 + -1]) ||
         (psVar2->ai1_sps_max_dec_pic_buffering[(long)psVar2->i1_sps_max_sub_layers + 6] !=
          psVar1[0x10].ai1_sps_max_dec_pic_buffering[lVar15 + 6])) {
        ps_codec->i4_reset_flag = 1;
        return 0x2a;
      }
    }
    UVar11 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].i1_log2_min_coding_block_size = (char)UVar11 + '\x03';
    UVar11 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].i1_log2_diff_max_min_coding_block_size = (char)UVar11;
    cVar5 = psVar1[0x10].i1_log2_min_coding_block_size;
    UVar13 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].i1_log2_min_transform_block_size = (char)UVar13 + '\x02';
    UVar13 = ihevcd_uev(ps_bitstrm);
    cVar6 = (char)UVar13;
    psVar1[0x10].i1_log2_diff_max_min_transform_block_size = cVar6;
    bVar16 = psVar1[0x10].i1_log2_min_transform_block_size + cVar6;
    psVar1[0x10].i1_log2_max_transform_block_size = bVar16;
    if (-1 < (char)bVar16) {
      iVar21 = (int)(char)UVar11 + (int)cVar5;
      iVar23 = 5;
      if (iVar21 < 5) {
        iVar23 = iVar21;
      }
      if ((int)(uint)bVar16 <= iVar23) {
        cVar5 = psVar1[0x10].i1_log2_diff_max_min_coding_block_size +
                psVar1[0x10].i1_log2_min_coding_block_size;
        psVar1[0x10].i1_log2_ctb_size = cVar5;
        if ((((-1 < cVar6) && ('\x01' < psVar1[0x10].i1_log2_min_transform_block_size)) &&
            ('\x02' < psVar1[0x10].i1_log2_min_coding_block_size)) &&
           (0xfc < (byte)(cVar5 - 7U) && (char)bVar16 <= cVar5)) {
          psVar1[0x10].i1_log2_min_pcm_coding_block_size = '\0';
          psVar1[0x10].i1_log2_diff_max_min_pcm_coding_block_size = '\0';
          UVar11 = ihevcd_uev(ps_bitstrm);
          psVar1[0x10].i1_max_transform_hierarchy_depth_inter = (WORD8)UVar11;
          UVar11 = ihevcd_uev(ps_bitstrm);
          psVar1[0x10].i1_max_transform_hierarchy_depth_intra = (WORD8)UVar11;
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_scaling_list_enable_flag = (char)UVar11;
          memcpy(psVar1[0x10].pi2_scaling_mat,gi2_flat_scale_mat_32x32,0xc0);
          if ((char)UVar11 == '\0') {
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x60,gi2_flat_scale_mat_32x32,0x300);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x1e0,gi2_flat_scale_mat_32x32,0x600);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x4e0,gi2_flat_scale_mat_32x32,0x600);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x7e0,gi2_flat_scale_mat_32x32,0x800);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0xbe0,gi2_flat_scale_mat_32x32,0x800);
          }
          else {
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x60,gi2_intra_default_scale_mat_8x8,0x80);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0xa0,gi2_intra_default_scale_mat_8x8,0x80);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0xe0,gi2_intra_default_scale_mat_8x8,0x80);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x120,gi2_inter_default_scale_mat_8x8,0x80);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x160,gi2_inter_default_scale_mat_8x8,0x80);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x1a0,gi2_inter_default_scale_mat_8x8,0x80);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x1e0,gi2_intra_default_scale_mat_16x16,0x200);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x2e0,gi2_intra_default_scale_mat_16x16,0x200);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x3e0,gi2_intra_default_scale_mat_16x16,0x200);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x4e0,gi2_inter_default_scale_mat_16x16,0x200);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x5e0,gi2_inter_default_scale_mat_16x16,0x200);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x6e0,gi2_inter_default_scale_mat_16x16,0x200);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0x7e0,gi2_intra_default_scale_mat_32x32,0x800);
            memcpy(psVar1[0x10].pi2_scaling_mat + 0xbe0,gi2_inter_default_scale_mat_32x32,0x800);
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].i1_sps_scaling_list_data_present_flag = (char)UVar11;
            if ((char)UVar11 != '\0') {
              ihevcd_scaling_list_data(ps_codec,psVar1[0x10].pi2_scaling_mat);
            }
          }
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_amp_enabled_flag = (WORD8)UVar11;
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_sample_adaptive_offset_enabled_flag = (WORD8)UVar11;
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_pcm_enabled_flag = (char)UVar11;
          if ((char)UVar11 != '\0') {
            UVar11 = ihevcd_bits_get(ps_bitstrm,4);
            psVar1[0x10].i1_pcm_sample_bit_depth_luma = (char)UVar11 + '\x01';
            UVar11 = ihevcd_bits_get(ps_bitstrm,4);
            psVar1[0x10].i1_pcm_sample_bit_depth_chroma = (char)UVar11 + '\x01';
            UVar11 = ihevcd_uev(ps_bitstrm);
            psVar1[0x10].i1_log2_min_pcm_coding_block_size = (char)UVar11 + '\x03';
            UVar11 = ihevcd_uev(ps_bitstrm);
            psVar1[0x10].i1_log2_diff_max_min_pcm_coding_block_size = (WORD8)UVar11;
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].i1_pcm_loop_filter_disable_flag = (WORD8)UVar11;
          }
          UVar13 = ihevcd_uev(ps_bitstrm);
          lVar19 = 0;
          UVar11 = UVar13;
          if ((char)UVar13 < '\0') {
            UVar11 = 0;
          }
          UVar17 = 0x40;
          if ((char)UVar13 < 'A') {
            UVar17 = UVar11;
          }
          psVar1[0x10].i1_num_short_term_ref_pic_sets = (WORD8)UVar17;
          ps_stref_picset = psVar1[0x10].as_stref_picset;
          for (; lVar19 < (char)UVar17; lVar19 = lVar19 + 1) {
            ihevcd_short_term_ref_pic_set
                      (ps_bitstrm,psVar1[0x10].as_stref_picset,(int)(char)UVar17,(WORD32)lVar19,
                       ps_stref_picset);
            UVar17 = (UWORD32)(byte)psVar1[0x10].i1_num_short_term_ref_pic_sets;
            ps_stref_picset = ps_stref_picset + 1;
          }
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_long_term_ref_pics_present_flag = (char)UVar11;
          if ((char)UVar11 != '\0') {
            UVar11 = ihevcd_uev(ps_bitstrm);
            psVar1[0x10].i1_num_long_term_ref_pics_sps = (WORD8)UVar11;
            for (lVar19 = 0; lVar19 < (char)UVar11; lVar19 = lVar19 + 1) {
              UVar11 = ihevcd_bits_get(ps_bitstrm,(int)psVar1[0x10].i1_log2_max_pic_order_cnt_lsb);
              psVar1[0x10].au2_lt_ref_pic_poc_lsb_sps[lVar19] = (UWORD16)UVar11;
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].ai1_used_by_curr_pic_lt_sps_flag[lVar19] = (WORD8)UVar11;
              UVar11 = (UWORD32)(byte)psVar1[0x10].i1_num_long_term_ref_pics_sps;
            }
          }
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_sps_temporal_mvp_enable_flag = (WORD8)UVar11;
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_strong_intra_smoothing_enable_flag = (WORD8)UVar11;
          UVar11 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_vui_parameters_present_flag = (char)UVar11;
          if ((char)UVar11 != '\0') {
            bVar16 = psVar1[0x10].i1_sps_max_sub_layers;
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_aspect_ratio_info_present_flag = (UWORD8)UVar11;
            psVar1[0x10].s_vui_parameters.u1_aspect_ratio_idc = '\0';
            if ((UWORD8)UVar11 == '\0') {
              UVar25 = 0;
              UVar10 = 0;
            }
            else {
              UVar11 = ihevcd_bits_get(ps_bitstrm,8);
              psVar1[0x10].s_vui_parameters.u1_aspect_ratio_idc = (UWORD8)UVar11;
              UVar10 = 1;
              switch(UVar11 & 0xff) {
              case 1:
                UVar25 = 1;
                break;
              case 2:
                UVar10 = 0xb;
                UVar25 = 0xc;
                break;
              case 3:
                UVar10 = 0xb;
                UVar25 = 10;
                break;
              case 4:
                UVar10 = 0xb;
                UVar25 = 0x10;
                break;
              case 5:
                UVar10 = 0x21;
                UVar25 = 0x28;
                break;
              case 6:
                UVar10 = 0xb;
                UVar25 = 0x18;
                break;
              case 7:
                UVar10 = 0xb;
                UVar25 = 0x14;
                break;
              case 8:
                UVar10 = 0xb;
                UVar25 = 0x20;
                break;
              case 9:
                UVar10 = 0x21;
                UVar25 = 0x50;
                break;
              case 10:
                UVar10 = 0xb;
                UVar25 = 0x12;
                break;
              case 0xb:
                UVar10 = 0xb;
                UVar25 = 0xf;
                break;
              case 0xc:
                UVar10 = 0x21;
                UVar25 = 0x40;
                break;
              case 0xd:
                UVar10 = 99;
                UVar25 = 0xa0;
                break;
              case 0xe:
                UVar10 = 3;
                UVar25 = 4;
                break;
              case 0xf:
                UVar10 = 2;
                UVar25 = 3;
                break;
              case 0x10:
                UVar25 = 2;
                break;
              default:
                if ((UVar11 & 0xff) == 0xff) {
                  UVar11 = ihevcd_bits_get(ps_bitstrm,0x10);
                  UVar25 = (UWORD16)UVar11;
                  UVar11 = ihevcd_bits_get(ps_bitstrm,0x10);
                  UVar10 = (UWORD16)UVar11;
                }
                else {
                  UVar25 = 0;
                  UVar10 = 0;
                }
              }
            }
            psVar1[0x10].s_vui_parameters.u2_sar_width = UVar25;
            psVar1[0x10].s_vui_parameters.u2_sar_height = UVar10;
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_overscan_info_present_flag = (UWORD8)UVar11;
            psVar1[0x10].s_vui_parameters.u1_overscan_appropriate_flag = '\0';
            if ((UWORD8)UVar11 != '\0') {
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_overscan_appropriate_flag = (UWORD8)UVar11;
            }
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_video_signal_type_present_flag = (UWORD8)UVar11;
            psVar1[0x10].s_vui_parameters.u1_video_format = '\x05';
            psVar1[0x10].s_vui_parameters.u1_video_full_range_flag = '\0';
            psVar1[0x10].s_vui_parameters.u1_colour_description_present_flag = '\0';
            psVar1[0x10].s_vui_parameters.u1_colour_primaries = '\x02';
            psVar1[0x10].s_vui_parameters.u1_transfer_characteristics = '\x02';
            psVar1[0x10].s_vui_parameters.u1_matrix_coefficients = '\x02';
            if ((UWORD8)UVar11 != '\0') {
              UVar11 = ihevcd_bits_get(ps_bitstrm,3);
              psVar1[0x10].s_vui_parameters.u1_video_format = (UWORD8)UVar11;
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_video_full_range_flag = (UWORD8)UVar11;
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_colour_description_present_flag = (UWORD8)UVar11;
              if ((UWORD8)UVar11 != '\0') {
                UVar11 = ihevcd_bits_get(ps_bitstrm,8);
                psVar1[0x10].s_vui_parameters.u1_colour_primaries = (UWORD8)UVar11;
                UVar11 = ihevcd_bits_get(ps_bitstrm,8);
                psVar1[0x10].s_vui_parameters.u1_transfer_characteristics = (UWORD8)UVar11;
                UVar11 = ihevcd_bits_get(ps_bitstrm,8);
                psVar1[0x10].s_vui_parameters.u1_matrix_coefficients = (UWORD8)UVar11;
              }
            }
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_chroma_loc_info_present_flag = (UWORD8)UVar11;
            psVar1[0x10].s_vui_parameters.u1_chroma_sample_loc_type_top_field = '\0';
            psVar1[0x10].s_vui_parameters.u1_chroma_sample_loc_type_bottom_field = '\0';
            if ((UWORD8)UVar11 != '\0') {
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u1_chroma_sample_loc_type_top_field = (UWORD8)UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u1_chroma_sample_loc_type_bottom_field = (UWORD8)UVar11;
            }
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_neutral_chroma_indication_flag = (UWORD8)UVar11;
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_field_seq_flag = (UWORD8)UVar11;
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_frame_field_info_present_flag = (UWORD8)UVar11;
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_default_display_window_flag = (UWORD8)UVar11;
            psVar1[0x10].s_vui_parameters.u4_def_disp_win_left_offset = 0;
            psVar1[0x10].s_vui_parameters.u4_def_disp_win_right_offset = 0;
            psVar1[0x10].s_vui_parameters.u4_def_disp_win_top_offset = 0;
            psVar1[0x10].s_vui_parameters.u4_def_disp_win_bottom_offset = 0;
            if ((UWORD8)UVar11 != '\0') {
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u4_def_disp_win_left_offset = UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u4_def_disp_win_right_offset = UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u4_def_disp_win_top_offset = UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u4_def_disp_win_bottom_offset = UVar11;
            }
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_vui_timing_info_present_flag = (UWORD8)UVar11;
            if ((UWORD8)UVar11 != '\0') {
              UVar11 = ihevcd_bits_get(ps_bitstrm,0x20);
              psVar1[0x10].s_vui_parameters.u4_vui_num_units_in_tick = UVar11;
              UVar11 = ihevcd_bits_get(ps_bitstrm,0x20);
              psVar1[0x10].s_vui_parameters.u4_vui_time_scale = UVar11;
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_poc_proportional_to_timing_flag = (UWORD8)UVar11;
              if ((UWORD8)UVar11 != '\0') {
                UVar11 = ihevcd_uev(ps_bitstrm);
                psVar1[0x10].s_vui_parameters.u1_num_ticks_poc_diff_one_minus1 = (UWORD8)UVar11;
              }
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_vui_hrd_parameters_present_flag = (UWORD8)UVar11;
              if ((UWORD8)UVar11 != '\0') {
                psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                u1_nal_hrd_parameters_present_flag = '\0';
                psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                u1_vcl_hrd_parameters_present_flag = '\0';
                *(undefined1 (*) [16])
                 &psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                  u1_sub_pic_cpb_params_present_flag = (undefined1  [16])0x0;
                *(undefined1 *)
                 ((long)&psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.u4_cpb_size_du_scale + 3
                 ) = 0;
                psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                u1_initial_cpb_removal_delay_length_minus1 = '\x17';
                psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                u1_au_cpb_removal_delay_length_minus1 = '\x17';
                psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.u1_dpb_output_delay_length_minus1
                     = '\x17';
                UVar11 = ihevcd_bits_get(ps_bitstrm,1);
                psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                u1_nal_hrd_parameters_present_flag = (UWORD8)UVar11;
                UVar11 = ihevcd_bits_get(ps_bitstrm,1);
                psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                u1_vcl_hrd_parameters_present_flag = (UWORD8)UVar11;
                if ((UWORD8)UVar11 != '\0' ||
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                    u1_nal_hrd_parameters_present_flag != '\0') {
                  UVar11 = ihevcd_bits_get(ps_bitstrm,1);
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                  u1_sub_pic_cpb_params_present_flag = (UWORD8)UVar11;
                  if ((UWORD8)UVar11 != '\0') {
                    UVar11 = ihevcd_bits_get(ps_bitstrm,8);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.u1_tick_divisor_minus2 =
                         (UWORD8)UVar11;
                    UVar11 = ihevcd_bits_get(ps_bitstrm,5);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                    u1_du_cpb_removal_delay_increment_length_minus1 = (UWORD8)UVar11;
                    UVar11 = ihevcd_bits_get(ps_bitstrm,1);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                    u1_sub_pic_cpb_params_in_pic_timing_sei_flag = (UWORD8)UVar11;
                    UVar11 = ihevcd_bits_get(ps_bitstrm,5);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                    u1_dpb_output_delay_du_length_minus1 = (UWORD8)UVar11;
                  }
                  UVar11 = ihevcd_bits_get(ps_bitstrm,4);
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.u4_bit_rate_scale = UVar11;
                  UVar11 = ihevcd_bits_get(ps_bitstrm,4);
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.u4_cpb_size_scale = UVar11;
                  if (psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                      u1_sub_pic_cpb_params_present_flag != '\0') {
                    UVar11 = ihevcd_bits_get(ps_bitstrm,4);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.u4_cpb_size_du_scale = UVar11
                    ;
                  }
                  UVar11 = ihevcd_bits_get(ps_bitstrm,5);
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                  u1_initial_cpb_removal_delay_length_minus1 = (UWORD8)UVar11;
                  UVar11 = ihevcd_bits_get(ps_bitstrm,5);
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                  u1_au_cpb_removal_delay_length_minus1 = (UWORD8)UVar11;
                  UVar11 = ihevcd_bits_get(ps_bitstrm,5);
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                  u1_dpb_output_delay_length_minus1 = (UWORD8)UVar11;
                }
                if ((char)bVar16 < '\x01') {
                  bVar16 = 0;
                }
                ps_sub_layer_hrd_params =
                     psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.as_sub_layer_hrd_params;
                for (uVar24 = 0; bVar16 != uVar24; uVar24 = uVar24 + 1) {
                  UVar11 = ihevcd_bits_get(ps_bitstrm,1);
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.au1_fixed_pic_rate_general_flag
                  [uVar24] = (UWORD8)UVar11;
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                  au1_fixed_pic_rate_within_cvs_flag[uVar24] = '\x01';
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                  au1_elemental_duration_in_tc_minus1[uVar24] = '\0';
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.au1_low_delay_hrd_flag[uVar24]
                       = '\0';
                  psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.au1_cpb_cnt_minus1[uVar24] =
                       '\0';
                  if ((UWORD8)UVar11 == '\0') {
                    UVar11 = ihevcd_bits_get(ps_bitstrm,1);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                    au1_fixed_pic_rate_within_cvs_flag[uVar24] = (UWORD8)UVar11;
                    if ((UWORD8)UVar11 != '\0') goto LAB_00110672;
                    UVar11 = ihevcd_bits_get(ps_bitstrm,1);
                    UVar7 = (UWORD8)UVar11;
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.au1_low_delay_hrd_flag
                    [uVar24] = UVar7;
                  }
                  else {
LAB_00110672:
                    UVar11 = ihevcd_uev(ps_bitstrm);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                    au1_elemental_duration_in_tc_minus1[uVar24] = (UWORD8)UVar11;
                    UVar7 = psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                            au1_low_delay_hrd_flag[uVar24];
                  }
                  if (UVar7 == '\0') {
                    UVar11 = ihevcd_uev(ps_bitstrm);
                    psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.au1_cpb_cnt_minus1[uVar24] =
                         (UWORD8)UVar11;
                  }
                  if (psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                      u1_nal_hrd_parameters_present_flag != '\0') {
                    ihevcd_parse_sub_layer_hrd_parameters
                              (ps_bitstrm,ps_sub_layer_hrd_params,
                               (uint)psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                                     au1_cpb_cnt_minus1[uVar24],
                               (uint)psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                                     u1_sub_pic_cpb_params_present_flag);
                  }
                  if (psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                      u1_vcl_hrd_parameters_present_flag != '\0') {
                    ihevcd_parse_sub_layer_hrd_parameters
                              (ps_bitstrm,ps_sub_layer_hrd_params,
                               (uint)psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                                     au1_cpb_cnt_minus1[uVar24],
                               (uint)psVar1[0x10].s_vui_parameters.s_vui_hrd_parameters.
                                     u1_sub_pic_cpb_params_present_flag);
                  }
                  ps_sub_layer_hrd_params = ps_sub_layer_hrd_params + 1;
                }
              }
            }
            UVar11 = ihevcd_bits_get(ps_bitstrm,1);
            psVar1[0x10].s_vui_parameters.u1_bitstream_restriction_flag = (UWORD8)UVar11;
            psVar1[0x10].s_vui_parameters.u1_tiles_fixed_structure_flag = '\0';
            psVar1[0x10].s_vui_parameters.u1_motion_vectors_over_pic_boundaries_flag = '\x01';
            psVar1[0x10].s_vui_parameters.u1_restricted_ref_pic_lists_flag = '\0';
            psVar1[0x10].s_vui_parameters.u4_min_spatial_segmentation_idc = 0;
            psVar1[0x10].s_vui_parameters.u1_max_bytes_per_pic_denom = '\x02';
            psVar1[0x10].s_vui_parameters.u1_max_bits_per_mincu_denom = '\x01';
            psVar1[0x10].s_vui_parameters.u1_log2_max_mv_length_horizontal = '\x0f';
            psVar1[0x10].s_vui_parameters.u1_log2_max_mv_length_vertical = '\x0f';
            if ((UWORD8)UVar11 != '\0') {
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_tiles_fixed_structure_flag = (UWORD8)UVar11;
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_motion_vectors_over_pic_boundaries_flag =
                   (UWORD8)UVar11;
              UVar11 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].s_vui_parameters.u1_restricted_ref_pic_lists_flag = (UWORD8)UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u4_min_spatial_segmentation_idc = UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u1_max_bytes_per_pic_denom = (UWORD8)UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u1_max_bits_per_mincu_denom = (UWORD8)UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u1_log2_max_mv_length_horizontal = (UWORD8)UVar11;
              UVar11 = ihevcd_uev(ps_bitstrm);
              psVar1[0x10].s_vui_parameters.u1_log2_max_mv_length_vertical = (UWORD8)UVar11;
            }
          }
          ihevcd_bits_get(ps_bitstrm,1);
          iVar23 = 1 << (psVar1[0x10].i1_log2_ctb_size & 0x1fU);
          sVar8 = psVar1[0x10].i2_pic_width_in_luma_samples;
          iVar21 = (int)sVar8;
          sVar3 = (short)((iVar23 + iVar21 + -1) / iVar23);
          psVar1[0x10].i2_pic_wd_in_ctb = sVar3;
          iVar22 = (int)psVar1[0x10].i2_pic_height_in_luma_samples;
          sVar4 = (short)((iVar23 + iVar22 + -1) / iVar23);
          psVar1[0x10].i2_pic_ht_in_ctb = sVar4;
          iVar23 = (int)sVar3 * (int)sVar4;
          psVar1[0x10].i4_pic_size_in_ctb = iVar23;
          if (ps_codec->i4_sps_done == 0) {
            (ps_codec->s_parse).i4_next_ctb_indx = iVar23;
          }
          iVar23 = 1 << (psVar1[0x10].i1_log2_min_coding_block_size & 0x1fU);
          psVar1[0x10].i2_pic_wd_in_min_cb = (WORD16)(iVar21 / iVar23);
          psVar1[0x10].i2_pic_ht_in_min_cb = (WORD16)(iVar22 / iVar23);
          if ((ps_codec->i4_first_pic_done != 0) &&
             ((ps_codec->i4_wd != iVar21 || (ps_codec->i4_ht != iVar22)))) {
            ps_codec->i4_reset_flag = 1;
            return 0x2a;
          }
          if (0x2100 < sVar8) {
            return 0x11;
          }
          if (0x22ce000 < iVar22 * iVar21) {
            return 0x11;
          }
          bVar26 = psVar1[0x10].i1_chroma_format_idc == '\x01';
          iVar23 = (int)psVar1[0x10].i2_pic_crop_right_offset +
                   (int)psVar1[0x10].i2_pic_crop_left_offset << bVar26;
          uVar14 = iVar21 - iVar23;
          if (uVar14 != 0 && iVar23 <= iVar21) {
            iVar23 = iVar22 - ((int)psVar1[0x10].i2_pic_crop_bottom_offset +
                               (int)psVar1[0x10].i2_pic_crop_top_offset << bVar26);
            if (0 < iVar23) {
              ps_codec->i4_disp_wd = uVar14;
              ps_codec->i4_disp_ht = iVar23;
              ps_codec->i4_wd = iVar21;
              ps_codec->i4_ht = iVar22;
              uVar20 = iVar21 + 0xbfU & 0xffffffe0;
              uVar18 = ps_codec->i4_strd;
              if (ps_codec->i4_strd < (int)uVar20) {
                ps_codec->i4_strd = uVar20;
                uVar18 = uVar20;
              }
              if (ps_codec->i4_share_disp_buf != 0) {
                uVar14 = uVar18;
              }
              if (ps_codec->i4_disp_strd < (int)uVar14) {
                ps_codec->i4_disp_strd = uVar14;
              }
              ps_codec->i4_sps_done = 1;
              return 0;
            }
            return IHEVCD_INVALID_PARAMETER;
          }
        }
      }
    }
  }
  return IHEVCD_INVALID_PARAMETER;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_sps(codec_t *ps_codec)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;

    WORD32 i;
    WORD32 vps_id;
    WORD32 sps_max_sub_layers;
    WORD32 sps_id;
    WORD32 sps_temporal_id_nesting_flag;
    sps_t *ps_sps;
    profile_tier_lvl_info_t s_ptl;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    WORD32 ctb_log2_size_y = 0;


    BITS_PARSE("video_parameter_set_id", value, ps_bitstrm, 4);
    vps_id = value;
    vps_id = CLIP3(vps_id, 0, MAX_VPS_CNT - 1);

    BITS_PARSE("sps_max_sub_layers_minus1", value, ps_bitstrm, 3);
    sps_max_sub_layers = value + 1;
    sps_max_sub_layers = CLIP3(sps_max_sub_layers, 1, 7);

    BITS_PARSE("sps_temporal_id_nesting_flag", value, ps_bitstrm, 1);
    sps_temporal_id_nesting_flag = value;

    //profile_and_level( 1, sps_max_sub_layers_minus1 )
    ret = ihevcd_profile_tier_level(ps_bitstrm, &(s_ptl), 1,
                                    (sps_max_sub_layers - 1));

    UEV_PARSE("seq_parameter_set_id", value, ps_bitstrm);
    sps_id = value;

    if((sps_id >= MAX_SPS_CNT) || (sps_id < 0))
    {
        if(ps_codec->i4_sps_done)
            return IHEVCD_UNSUPPORTED_SPS_ID;
        else
            sps_id = 0;
    }


    ps_sps = (ps_codec->s_parse.ps_sps_base + MAX_SPS_CNT - 1);
    ps_sps->i1_sps_id = sps_id;
    ps_sps->i1_vps_id = vps_id;
    ps_sps->i1_sps_max_sub_layers = sps_max_sub_layers;
    ps_sps->i1_sps_temporal_id_nesting_flag = sps_temporal_id_nesting_flag;
    /* This is used only during initialization to get reorder count etc */
    ps_codec->i4_sps_id = sps_id;
    memcpy(&ps_sps->s_ptl, &s_ptl, sizeof(profile_tier_lvl_info_t));

    UEV_PARSE("chroma_format_idc", value, ps_bitstrm);
    ps_sps->i1_chroma_format_idc = value;

    if(ps_sps->i1_chroma_format_idc != CHROMA_FMT_IDC_YUV420)
    {
        ps_codec->s_parse.i4_error_code = IHEVCD_UNSUPPORTED_CHROMA_FMT_IDC;
        return (IHEVCD_ERROR_T)IHEVCD_UNSUPPORTED_CHROMA_FMT_IDC;
    }

    if(CHROMA_FMT_IDC_YUV444_PLANES == ps_sps->i1_chroma_format_idc)
    {
        BITS_PARSE("separate_colour_plane_flag", value, ps_bitstrm, 1);
        ps_sps->i1_separate_colour_plane_flag = value;
    }
    else
    {
        ps_sps->i1_separate_colour_plane_flag = 0;
    }

    UEV_PARSE("pic_width_in_luma_samples", value, ps_bitstrm);
    ps_sps->i2_pic_width_in_luma_samples = value;

    UEV_PARSE("pic_height_in_luma_samples", value, ps_bitstrm);
    ps_sps->i2_pic_height_in_luma_samples = value;

    if((0 >= ps_sps->i2_pic_width_in_luma_samples) || (0 >= ps_sps->i2_pic_height_in_luma_samples))
        return IHEVCD_INVALID_PARAMETER;

    /* i2_pic_width_in_luma_samples and i2_pic_height_in_luma_samples
       should be multiples of min_cb_size. Here these are aligned to 8,
       i.e. smallest CB size */
    ps_sps->i2_pic_width_in_luma_samples = ALIGN8(ps_sps->i2_pic_width_in_luma_samples);
    ps_sps->i2_pic_height_in_luma_samples = ALIGN8(ps_sps->i2_pic_height_in_luma_samples);

    BITS_PARSE("pic_cropping_flag", value, ps_bitstrm, 1);
    ps_sps->i1_pic_cropping_flag = value;

    if(ps_sps->i1_pic_cropping_flag)
    {

        UEV_PARSE("pic_crop_left_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_left_offset = value;

        UEV_PARSE("pic_crop_right_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_right_offset = value;

        UEV_PARSE("pic_crop_top_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_top_offset = value;

        UEV_PARSE("pic_crop_bottom_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_bottom_offset = value;
    }
    else
    {
        ps_sps->i2_pic_crop_left_offset = 0;
        ps_sps->i2_pic_crop_right_offset = 0;
        ps_sps->i2_pic_crop_top_offset = 0;
        ps_sps->i2_pic_crop_bottom_offset = 0;
    }


    UEV_PARSE("bit_depth_luma_minus8", value, ps_bitstrm);
    if(0 != value)
        return IHEVCD_UNSUPPORTED_BIT_DEPTH;

    UEV_PARSE("bit_depth_chroma_minus8", value, ps_bitstrm);
    if(0 != value)
        return IHEVCD_UNSUPPORTED_BIT_DEPTH;

    UEV_PARSE("log2_max_pic_order_cnt_lsb_minus4", value, ps_bitstrm);
    ps_sps->i1_log2_max_pic_order_cnt_lsb = value + 4;

    BITS_PARSE("sps_sub_layer_ordering_info_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sps_sub_layer_ordering_info_present_flag = value;


    i = (ps_sps->i1_sps_sub_layer_ordering_info_present_flag ? 0 : (ps_sps->i1_sps_max_sub_layers - 1));
    for(; i < ps_sps->i1_sps_max_sub_layers; i++)
    {
        UEV_PARSE("max_dec_pic_buffering", value, ps_bitstrm);
        ps_sps->ai1_sps_max_dec_pic_buffering[i] = value + 1;

        if(ps_sps->ai1_sps_max_dec_pic_buffering[i] > MAX_DPB_SIZE)
        {
            return IHEVCD_INVALID_PARAMETER;
        }

        UEV_PARSE("num_reorder_pics", value, ps_bitstrm);
        ps_sps->ai1_sps_max_num_reorder_pics[i] = value;

        if(ps_sps->ai1_sps_max_num_reorder_pics[i] > ps_sps->ai1_sps_max_dec_pic_buffering[i])
        {
            return IHEVCD_INVALID_PARAMETER;
        }

        UEV_PARSE("max_latency_increase", value, ps_bitstrm);
        ps_sps->ai1_sps_max_latency_increase[i] = value;
    }

    /* Check if sps_max_dec_pic_buffering or sps_max_num_reorder_pics
       has changed */
    if(0 != ps_codec->i4_first_pic_done)
    {
        sps_t *ps_sps_old = ps_codec->s_parse.ps_sps;
        if(ps_sps_old->ai1_sps_max_dec_pic_buffering[ps_sps_old->i1_sps_max_sub_layers - 1] !=
                    ps_sps->ai1_sps_max_dec_pic_buffering[ps_sps->i1_sps_max_sub_layers - 1])
        {
            ps_codec->i4_reset_flag = 1;
            return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
        }

        if(ps_sps_old->ai1_sps_max_num_reorder_pics[ps_sps_old->i1_sps_max_sub_layers - 1] !=
                    ps_sps->ai1_sps_max_num_reorder_pics[ps_sps->i1_sps_max_sub_layers - 1])
        {
            ps_codec->i4_reset_flag = 1;
            return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
        }
    }

    UEV_PARSE("log2_min_coding_block_size_minus3", value, ps_bitstrm);
    ps_sps->i1_log2_min_coding_block_size = value + 3;

    UEV_PARSE("log2_diff_max_min_coding_block_size", value, ps_bitstrm);
    ps_sps->i1_log2_diff_max_min_coding_block_size = value;

    ctb_log2_size_y = ps_sps->i1_log2_min_coding_block_size + ps_sps->i1_log2_diff_max_min_coding_block_size;

    UEV_PARSE("log2_min_transform_block_size_minus2", value, ps_bitstrm);
    ps_sps->i1_log2_min_transform_block_size = value + 2;

    UEV_PARSE("log2_diff_max_min_transform_block_size", value, ps_bitstrm);
    ps_sps->i1_log2_diff_max_min_transform_block_size = value;

    ps_sps->i1_log2_max_transform_block_size = ps_sps->i1_log2_min_transform_block_size +
                    ps_sps->i1_log2_diff_max_min_transform_block_size;

    if ((ps_sps->i1_log2_max_transform_block_size < 0) ||
                    (ps_sps->i1_log2_max_transform_block_size > MIN(ctb_log2_size_y, 5)))
    {
        return IHEVCD_INVALID_PARAMETER;
    }

    ps_sps->i1_log2_ctb_size = ps_sps->i1_log2_min_coding_block_size +
                    ps_sps->i1_log2_diff_max_min_coding_block_size;

    if((ps_sps->i1_log2_min_coding_block_size < 3) ||
                    (ps_sps->i1_log2_min_transform_block_size < 2) ||
                    (ps_sps->i1_log2_diff_max_min_transform_block_size < 0) ||
                    (ps_sps->i1_log2_max_transform_block_size > ps_sps->i1_log2_ctb_size) ||
                    (ps_sps->i1_log2_ctb_size < 4) ||
                    (ps_sps->i1_log2_ctb_size > 6))
    {
        return IHEVCD_INVALID_PARAMETER;
    }

    ps_sps->i1_log2_min_pcm_coding_block_size = 0;
    ps_sps->i1_log2_diff_max_min_pcm_coding_block_size = 0;

    UEV_PARSE("max_transform_hierarchy_depth_inter", value, ps_bitstrm);
    ps_sps->i1_max_transform_hierarchy_depth_inter = value;

    UEV_PARSE("max_transform_hierarchy_depth_intra", value, ps_bitstrm);
    ps_sps->i1_max_transform_hierarchy_depth_intra = value;

    /* String has a d (enabled) in order to match with HM */
    BITS_PARSE("scaling_list_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_scaling_list_enable_flag = value;

    if(ps_sps->i1_scaling_list_enable_flag)
    {
        COPY_DEFAULT_SCALING_LIST(ps_sps->pi2_scaling_mat);
        BITS_PARSE("sps_scaling_list_data_present_flag", value, ps_bitstrm, 1);
        ps_sps->i1_sps_scaling_list_data_present_flag = value;

        if(ps_sps->i1_sps_scaling_list_data_present_flag)
            ihevcd_scaling_list_data(ps_codec, ps_sps->pi2_scaling_mat);
    }
    else
    {
        COPY_FLAT_SCALING_LIST(ps_sps->pi2_scaling_mat);
    }
    /* String is asymmetric_motion_partitions_enabled_flag instead of amp_enabled_flag in order to match with HM */
    BITS_PARSE("asymmetric_motion_partitions_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_amp_enabled_flag = value;

    BITS_PARSE("sample_adaptive_offset_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sample_adaptive_offset_enabled_flag = value;

    BITS_PARSE("pcm_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_pcm_enabled_flag = value;

    if(ps_sps->i1_pcm_enabled_flag)
    {
        BITS_PARSE("pcm_sample_bit_depth_luma", value, ps_bitstrm, 4);
        ps_sps->i1_pcm_sample_bit_depth_luma = value + 1;

        BITS_PARSE("pcm_sample_bit_depth_chroma", value, ps_bitstrm, 4);
        ps_sps->i1_pcm_sample_bit_depth_chroma = value + 1;

        UEV_PARSE("log2_min_pcm_coding_block_size_minus3", value, ps_bitstrm);
        ps_sps->i1_log2_min_pcm_coding_block_size = value + 3;

        UEV_PARSE("log2_diff_max_min_pcm_coding_block_size", value, ps_bitstrm);
        ps_sps->i1_log2_diff_max_min_pcm_coding_block_size = value;
        BITS_PARSE("pcm_loop_filter_disable_flag", value, ps_bitstrm, 1);
        ps_sps->i1_pcm_loop_filter_disable_flag = value;

    }
    UEV_PARSE("num_short_term_ref_pic_sets", value, ps_bitstrm);
    ps_sps->i1_num_short_term_ref_pic_sets = value;

    ps_sps->i1_num_short_term_ref_pic_sets = CLIP3(ps_sps->i1_num_short_term_ref_pic_sets, 0, MAX_STREF_PICS_SPS);

    for(i = 0; i < ps_sps->i1_num_short_term_ref_pic_sets; i++)
        ihevcd_short_term_ref_pic_set(ps_bitstrm, &ps_sps->as_stref_picset[0], ps_sps->i1_num_short_term_ref_pic_sets, i, &ps_sps->as_stref_picset[i]);

    BITS_PARSE("long_term_ref_pics_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_long_term_ref_pics_present_flag = value;

    if(ps_sps->i1_long_term_ref_pics_present_flag)
    {
        UEV_PARSE("num_long_term_ref_pics_sps", value, ps_bitstrm);
        ps_sps->i1_num_long_term_ref_pics_sps = value;

        for(i = 0; i < ps_sps->i1_num_long_term_ref_pics_sps; i++)
        {
            BITS_PARSE("lt_ref_pic_poc_lsb_sps[ i ]", value, ps_bitstrm, ps_sps->i1_log2_max_pic_order_cnt_lsb);
            ps_sps->au2_lt_ref_pic_poc_lsb_sps[i] = value;

            BITS_PARSE("used_by_curr_pic_lt_sps_flag[ i ]", value, ps_bitstrm, 1);
            ps_sps->ai1_used_by_curr_pic_lt_sps_flag[i] = value;
        }
    }

    BITS_PARSE("sps_temporal_mvp_enable_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sps_temporal_mvp_enable_flag = value;

    /* Print matches HM 8-2 */
    BITS_PARSE("sps_strong_intra_smoothing_enable_flag", value, ps_bitstrm, 1);
    ps_sps->i1_strong_intra_smoothing_enable_flag = value;

    BITS_PARSE("vui_parameters_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_vui_parameters_present_flag = value;

    if(ps_sps->i1_vui_parameters_present_flag)
        ihevcd_parse_vui_parameters(ps_bitstrm,
                                    &ps_sps->s_vui_parameters,
                                    ps_sps->i1_sps_max_sub_layers - 1);

    BITS_PARSE("sps_extension_flag", value, ps_bitstrm, 1);


    {
        WORD32 numerator;
        WORD32 ceil_offset;

        ceil_offset = (1 << ps_sps->i1_log2_ctb_size) - 1;
        numerator = ps_sps->i2_pic_width_in_luma_samples;

        ps_sps->i2_pic_wd_in_ctb = ((numerator + ceil_offset) /
                        (1 << ps_sps->i1_log2_ctb_size));

        numerator = ps_sps->i2_pic_height_in_luma_samples;
        ps_sps->i2_pic_ht_in_ctb = ((numerator + ceil_offset) /
                        (1 << ps_sps->i1_log2_ctb_size));

        ps_sps->i4_pic_size_in_ctb = ps_sps->i2_pic_ht_in_ctb *
                        ps_sps->i2_pic_wd_in_ctb;

        if(0 == ps_codec->i4_sps_done)
            ps_codec->s_parse.i4_next_ctb_indx = ps_sps->i4_pic_size_in_ctb;

        numerator = ps_sps->i2_pic_width_in_luma_samples;
        ps_sps->i2_pic_wd_in_min_cb = numerator  /
                        (1 << ps_sps->i1_log2_min_coding_block_size);

        numerator = ps_sps->i2_pic_height_in_luma_samples;
        ps_sps->i2_pic_ht_in_min_cb = numerator  /
                        (1 << ps_sps->i1_log2_min_coding_block_size);
    }
    if((0 != ps_codec->i4_first_pic_done) &&
                    ((ps_codec->i4_wd != ps_sps->i2_pic_width_in_luma_samples) ||
                    (ps_codec->i4_ht != ps_sps->i2_pic_height_in_luma_samples)))
    {
        ps_codec->i4_reset_flag = 1;
        return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
    }

    if((ps_sps->i2_pic_width_in_luma_samples > MAX_WD) ||
                    ((ps_sps->i2_pic_width_in_luma_samples * ps_sps->i2_pic_height_in_luma_samples) >
                    (MAX_WD * MAX_HT)))
    {
        return (IHEVCD_ERROR_T)IVD_STREAM_WIDTH_HEIGHT_NOT_SUPPORTED;
    }

    /* Update display width and display height */
    {
        WORD32 disp_wd, disp_ht;
        WORD32 crop_unit_x, crop_unit_y;
        crop_unit_x = 1;
        crop_unit_y = 1;

        if(CHROMA_FMT_IDC_YUV420 == ps_sps->i1_chroma_format_idc)
        {
            crop_unit_x = 2;
            crop_unit_y = 2;
        }

        disp_wd = ps_sps->i2_pic_width_in_luma_samples;
        disp_wd -= ps_sps->i2_pic_crop_left_offset * crop_unit_x;
        disp_wd -= ps_sps->i2_pic_crop_right_offset * crop_unit_x;


        disp_ht = ps_sps->i2_pic_height_in_luma_samples;
        disp_ht -= ps_sps->i2_pic_crop_top_offset * crop_unit_y;
        disp_ht -= ps_sps->i2_pic_crop_bottom_offset * crop_unit_y;

        if((0 >= disp_wd) || (0 >= disp_ht))
            return IHEVCD_INVALID_PARAMETER;

        ps_codec->i4_disp_wd = disp_wd;
        ps_codec->i4_disp_ht = disp_ht;


        ps_codec->i4_wd = ps_sps->i2_pic_width_in_luma_samples;
        ps_codec->i4_ht = ps_sps->i2_pic_height_in_luma_samples;

        {
            WORD32 ref_strd;
            ref_strd = ALIGN32(ps_sps->i2_pic_width_in_luma_samples + PAD_WD);
            if(ps_codec->i4_strd < ref_strd)
            {
                ps_codec->i4_strd = ref_strd;
            }
        }

        if(0 == ps_codec->i4_share_disp_buf)
        {
            if(ps_codec->i4_disp_strd < ps_codec->i4_disp_wd)
            {
                ps_codec->i4_disp_strd = ps_codec->i4_disp_wd;
            }
        }
        else
        {
            if(ps_codec->i4_disp_strd < ps_codec->i4_strd)
            {
                ps_codec->i4_disp_strd = ps_codec->i4_strd;
            }
        }
    }

    ps_codec->i4_sps_done = 1;
    return ret;
}